

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLogger.cpp
# Opt level: O0

void __thiscall liblogger::ProxyLogger::Logger(ProxyLogger *this,LogType Type,char *fmt,...)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  string str;
  int res;
  va_list ap;
  char *tmp;
  allocator<char> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  allocator<char> local_61;
  string local_60 [36];
  int local_3c;
  char *local_20;
  char *local_18;
  uint local_c;
  undefined8 local_8;
  
  local_20 = (char *)0x0;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_3c = vasprintf(&local_20,in_RDX,&stack0xffffffffffffffc8);
  if (local_3c < 0) {
    abort();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RCX,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::allocator<char>::~allocator(&local_61);
  uVar1 = local_c;
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  liblogger::Logger((LogType)(ulong)uVar1,"%s %s ",uVar2,uVar3);
  free(local_20);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void ProxyLogger::Logger(const LogType Type, const char *fmt, ...) {
    char *tmp = 0;
	va_list ap;
	va_start(ap, fmt);
	int res = vasprintf(&tmp, fmt, ap);
	if (res < 0)
		abort();
	std::string str = tmp;
	liblogger::Logger(Type, "%s %s ", m_prefix.c_str(), str.c_str());
	free(tmp);
	va_end(ap);
}